

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void mocker::ir::printModule(Module *module,ostream *out)

{
  bool bVar1;
  GlobalVarList *this;
  string *__lhs;
  char *pcVar2;
  ostream *poVar3;
  FuncsMap *this_00;
  reference pvVar4;
  value_type *kv;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  FuncsMap *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  reference local_88;
  char *ch;
  const_iterator __end3;
  const_iterator __begin3;
  string *__range3;
  string str;
  GlobalVar *var;
  const_iterator __end2;
  const_iterator __begin2;
  GlobalVarList *__range2;
  ostream *out_local;
  Module *module_local;
  
  this = Module::getGlobalVars_abi_cxx11_(module);
  __end2 = std::__cxx11::list<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>::begin
                     (this);
  var = (GlobalVar *)
        std::__cxx11::list<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>::end(this)
  ;
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&var);
    if (!bVar1) break;
    str.field_2._8_8_ = std::_List_const_iterator<mocker::ir::GlobalVar>::operator*(&__end2);
    __lhs = GlobalVar::getLabel_abi_cxx11_((GlobalVar *)str.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                   __lhs,":");
    GlobalVar::getData_abi_cxx11_((GlobalVar *)str.field_2._8_8_);
    __end3._M_current = (char *)std::__cxx11::string::begin();
    ch = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&ch);
      if (!bVar1) break;
      local_88 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3);
      std::__cxx11::to_string((string *)&__range2_1,(int)*local_88);
      std::operator+(&local_c8," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &__range2_1);
      std::operator+(&local_a8,&local_c8,",");
      std::__cxx11::string::operator+=((string *)&__range3,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 == ',') {
      std::__cxx11::string::pop_back();
    }
    poVar3 = std::operator<<(out,(string *)&__range3);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&__range3);
    std::_List_const_iterator<mocker::ir::GlobalVar>::operator++(&__end2);
  }
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  this_00 = Module::getFuncs_abi_cxx11_(module);
  __end2_1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
             ::begin(this_00);
  kv = (value_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2_1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                         *)&kv);
    if (!bVar1) break;
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_false,_true>
             ::operator*(&__end2_1);
    printFunc(&pvVar4->second,out);
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_false,_true>
    ::operator++(&__end2_1);
  }
  return;
}

Assistant:

void printModule(const Module &module, std::ostream &out) {
  for (auto &var : module.getGlobalVars()) {
    std::string str = var.getLabel() + ":";
    for (auto &ch : var.getData())
      str += " " + std::to_string(ch) + ",";
    if (str.back() == ',')
      str.pop_back();
    out << str << '\n';
  }
  out << std::endl;

  for (auto &kv : module.getFuncs()) {
    printFunc(kv.second, out);
    out << std::endl;
  }
}